

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O3

void __thiscall cmTcpIpConnection::Connect(cmTcpIpConnection *this,uv_stream_t *server)

{
  auto_tcp_t *this_00;
  cmServerBase *pcVar1;
  int iVar2;
  uv_handle_t *puVar3;
  uv_loop_t *ctx;
  uv_stream_t *puVar4;
  
  this_00 = &this->ClientHandle;
  puVar3 = ::auto_handle_base_::operator_cast_to_uv_handle_s_
                     ((auto_handle_base_<uv_tcp_s> *)this_00);
  if (puVar3 != (uv_handle_t *)0x0) {
    return;
  }
  ctx = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  auto_tcp_t::init(this_00,(EVP_PKEY_CTX *)ctx);
  puVar4 = auto_tcp_t::operator_cast_to_uv_stream_s_(this_00);
  iVar2 = uv_accept(server,puVar4);
  if (iVar2 != 0) {
    puVar3 = ::auto_handle_base_::operator_cast_to_uv_handle_s_
                       ((auto_handle_base_<uv_tcp_s> *)this_00);
    uv_close(puVar3,(uv_close_cb)0x0);
    return;
  }
  puVar4 = auto_tcp_t::operator_cast_to_uv_stream_s_(this_00);
  (this->super_cmEventBasedConnection).ReadStream = puVar4;
  puVar4 = auto_tcp_t::operator_cast_to_uv_stream_s_(this_00);
  (this->super_cmEventBasedConnection).WriteStream = puVar4;
  uv_read_start((this->super_cmEventBasedConnection).ReadStream,
                cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
  pcVar1 = (this->super_cmEventBasedConnection).super_cmConnection.Server;
  (*pcVar1->_vptr_cmServerBase[4])(pcVar1,this);
  return;
}

Assistant:

void cmTcpIpConnection::Connect(uv_stream_t* server)
{
  if ((uv_handle_t*)this->ClientHandle) {
    // Ignore it; we already have a connection
    return;
  }

  this->ClientHandle.init(*this->Server->GetLoop(),
                          static_cast<cmConnection*>(this));
  if (uv_accept(server, this->ClientHandle) != 0) {
    uv_close(this->ClientHandle, nullptr);
    return;
  }
  this->ReadStream = this->ClientHandle;
  this->WriteStream = this->ClientHandle;

  uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  this->Server->OnConnected(this);
}